

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3ResolveExprListNames(NameContext *pNC,ExprList *pList)

{
  uint uVar1;
  int iVar2;
  int *in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  Expr *pExpr;
  int savedHasAgg;
  int i;
  Walker w;
  int in_stack_ffffffffffffff9c;
  Parse *pParse;
  int iVar3;
  int local_3c;
  long local_38;
  code *local_30;
  code *local_28;
  undefined8 local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  memset(&local_38,0xaa,0x30);
  if (in_RSI == (int *)0x0) {
    local_3c = 0;
  }
  else {
    local_38 = *in_RDI;
    local_30 = resolveExprStep;
    local_28 = resolveSelectStep;
    local_20 = 0;
    uVar1 = *(uint *)(in_RDI + 5) & 0x8009010;
    *(uint *)(in_RDI + 5) = *(uint *)(in_RDI + 5) & 0xf7ff6fef;
    for (iVar3 = 0; iVar3 < *in_RSI; iVar3 = iVar3 + 1) {
      pParse = *(Parse **)(in_RSI + (long)iVar3 * 6 + 2);
      if (pParse != (Parse *)0x0) {
        *(int *)(local_38 + 0x13c) = *(int *)&pParse->mSubrtnSig + *(int *)(local_38 + 0x13c);
        iVar2 = sqlite3ExprCheckHeight(pParse,in_stack_ffffffffffffff9c);
        if (iVar2 != 0) {
          local_3c = 1;
          goto LAB_001d826b;
        }
        sqlite3WalkExprNN((Walker *)CONCAT44(iVar3,uVar1),(Expr *)pParse);
        *(int *)(local_38 + 0x13c) = *(int *)(local_38 + 0x13c) - *(int *)&pParse->mSubrtnSig;
        if ((*(uint *)(in_RDI + 5) & 0x8009010) != 0) {
          *(uint *)((long)&pParse->db + 4) =
               *(uint *)(in_RDI + 5) & 0x8010 | *(uint *)((long)&pParse->db + 4);
          uVar1 = *(uint *)(in_RDI + 5) & 0x8009010 | uVar1;
          *(uint *)(in_RDI + 5) = *(uint *)(in_RDI + 5) & 0xf7ff6fef;
        }
        if (0 < *(int *)(local_38 + 0x34)) {
          local_3c = 1;
          goto LAB_001d826b;
        }
      }
    }
    *(uint *)(in_RDI + 5) = uVar1 | *(uint *)(in_RDI + 5);
    local_3c = 0;
  }
LAB_001d826b:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_3c;
}

Assistant:

SQLITE_PRIVATE int sqlite3ResolveExprListNames(
  NameContext *pNC,       /* Namespace to resolve expressions in. */
  ExprList *pList         /* The expression list to be analyzed. */
){
  int i;
  int savedHasAgg = 0;
  Walker w;
  if( pList==0 ) return SQLITE_OK;
  w.pParse = pNC->pParse;
  w.xExprCallback = resolveExprStep;
  w.xSelectCallback = resolveSelectStep;
  w.xSelectCallback2 = 0;
  w.u.pNC = pNC;
  savedHasAgg = pNC->ncFlags & (NC_HasAgg|NC_MinMaxAgg|NC_HasWin|NC_OrderAgg);
  pNC->ncFlags &= ~(NC_HasAgg|NC_MinMaxAgg|NC_HasWin|NC_OrderAgg);
  for(i=0; i<pList->nExpr; i++){
    Expr *pExpr = pList->a[i].pExpr;
    if( pExpr==0 ) continue;
#if SQLITE_MAX_EXPR_DEPTH>0
    w.pParse->nHeight += pExpr->nHeight;
    if( sqlite3ExprCheckHeight(w.pParse, w.pParse->nHeight) ){
      return SQLITE_ERROR;
    }
#endif
    sqlite3WalkExprNN(&w, pExpr);
#if SQLITE_MAX_EXPR_DEPTH>0
    w.pParse->nHeight -= pExpr->nHeight;
#endif
    assert( EP_Agg==NC_HasAgg );
    assert( EP_Win==NC_HasWin );
    testcase( pNC->ncFlags & NC_HasAgg );
    testcase( pNC->ncFlags & NC_HasWin );
    if( pNC->ncFlags & (NC_HasAgg|NC_MinMaxAgg|NC_HasWin|NC_OrderAgg) ){
      ExprSetProperty(pExpr, pNC->ncFlags & (NC_HasAgg|NC_HasWin) );
      savedHasAgg |= pNC->ncFlags &
                          (NC_HasAgg|NC_MinMaxAgg|NC_HasWin|NC_OrderAgg);
      pNC->ncFlags &= ~(NC_HasAgg|NC_MinMaxAgg|NC_HasWin|NC_OrderAgg);
    }
    if( w.pParse->nErr>0 ) return SQLITE_ERROR;
  }
  pNC->ncFlags |= savedHasAgg;
  return SQLITE_OK;
}